

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::run_creation_work_item_raytracing
          (ThreadedReplayer *this,PipelineWorkItem *work_item)

{
  VkPipelineCache cache_00;
  uint local_24;
  uint i;
  VkPipelineCache cache;
  PipelineWorkItem *work_item_local;
  ThreadedReplayer *this_local;
  
  cache_00 = get_current_pipeline_cache(this,work_item);
  for (local_24 = 0; local_24 < this->loop_count; local_24 = local_24 + 1) {
    run_creation_work_item_raytracing_iteration(this,work_item,cache_00,local_24 == 0);
  }
  return;
}

Assistant:

void run_creation_work_item_raytracing(const PipelineWorkItem &work_item)
	{
		auto cache = get_current_pipeline_cache(work_item);
		for (unsigned i = 0; i < loop_count; i++)
			run_creation_work_item_raytracing_iteration(work_item, cache, i == 0);
	}